

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O3

UBool __thiscall
icu_63::ReorderingBuffer::appendSupplementary
          (ReorderingBuffer *this,UChar32 c,uint8_t cc,UErrorCode *errorCode)

{
  UChar *pUVar1;
  UBool UVar2;
  
  if ((this->remainingCapacity < 2) && (UVar2 = resize(this,2,errorCode), UVar2 == '\0')) {
    return '\0';
  }
  if ((cc == '\0') || (this->lastCC <= cc)) {
    pUVar1 = this->limit;
    *pUVar1 = (short)((uint)c >> 10) + L'ퟀ';
    pUVar1[1] = (ushort)c & 0x3ff | 0xdc00;
    this->limit = pUVar1 + 2;
    this->lastCC = cc;
    if (cc < 2) {
      this->reorderStart = pUVar1 + 2;
    }
  }
  else {
    insert(this,c,cc);
  }
  this->remainingCapacity = this->remainingCapacity + -2;
  return '\x01';
}

Assistant:

UBool ReorderingBuffer::appendSupplementary(UChar32 c, uint8_t cc, UErrorCode &errorCode) {
    if(remainingCapacity<2 && !resize(2, errorCode)) {
        return FALSE;
    }
    if(lastCC<=cc || cc==0) {
        limit[0]=U16_LEAD(c);
        limit[1]=U16_TRAIL(c);
        limit+=2;
        lastCC=cc;
        if(cc<=1) {
            reorderStart=limit;
        }
    } else {
        insert(c, cc);
    }
    remainingCapacity-=2;
    return TRUE;
}